

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

void __thiscall anon_unknown.dwarf_4611f9::ImplPosix::StartReceivingTokens(ImplPosix *this)

{
  int status;
  uv_stream_t *stream;
  
  if ((this->Conn != None) && (this->ReceivingTokens == false)) {
    stream = GetReader(this);
    status = uv_read_start(stream,OnAllocateCB,OnReadCB);
    if (status != 0) {
      Disconnect(this,status);
      return;
    }
    this->ReceivingTokens = true;
  }
  return;
}

Assistant:

void ImplPosix::StartReceivingTokens()
{
  if (this->Conn == Connection::None) {
    return;
  }
  if (this->ReceivingTokens) {
    return;
  }

  int status = uv_read_start(this->GetReader(), &ImplPosix::OnAllocateCB,
                             &ImplPosix::OnReadCB);
  if (status != 0) {
    this->Disconnect(status);
    return;
  }

  this->ReceivingTokens = true;
}